

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

void __thiscall FWeaponSlot::Sort(FWeaponSlot *this)

{
  int iVar1;
  PClassWeapon *pPVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  WeaponInfo *pWVar7;
  WeaponInfo *pWVar8;
  PClassWeapon *type;
  int local_18;
  int pos;
  int j;
  int i;
  FWeaponSlot *this_local;
  
  pos = 1;
  while( true ) {
    uVar6 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::Size(&this->Weapons);
    if ((int)uVar6 <= pos) break;
    pWVar7 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::operator[]
                       (&this->Weapons,(long)pos);
    iVar1 = pWVar7->Position;
    pWVar7 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::operator[]
                       (&this->Weapons,(long)pos);
    pPVar2 = pWVar7->Type;
    iVar4 = pos;
    while( true ) {
      local_18 = iVar4 + -1;
      bVar3 = false;
      if (-1 < local_18) {
        pWVar7 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::operator[]
                           (&this->Weapons,(long)local_18);
        bVar3 = iVar1 < pWVar7->Position;
      }
      if (!bVar3) break;
      pWVar7 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::operator[]
                         (&this->Weapons,(long)local_18);
      pWVar8 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::operator[]
                         (&this->Weapons,(long)iVar4);
      pWVar8->Type = pWVar7->Type;
      uVar5 = *(undefined4 *)&pWVar7->field_0xc;
      pWVar8->Position = pWVar7->Position;
      *(undefined4 *)&pWVar8->field_0xc = uVar5;
      iVar4 = local_18;
    }
    pWVar7 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::operator[]
                       (&this->Weapons,(long)iVar4);
    pWVar7->Type = pPVar2;
    pWVar7 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::operator[]
                       (&this->Weapons,(long)iVar4);
    pWVar7->Position = iVar1;
    pos = pos + 1;
  }
  return;
}

Assistant:

void FWeaponSlot::Sort()
{
	// This does not use qsort(), because the sort should be stable, and
	// there is no guarantee that qsort() is stable. This insertion sort
	// should be fine.
	int i, j;

	for (i = 1; i < (int)Weapons.Size(); ++i)
	{
		int pos = Weapons[i].Position;
		PClassWeapon *type = Weapons[i].Type;
		for (j = i - 1; j >= 0 && Weapons[j].Position > pos; --j)
		{
			Weapons[j + 1] = Weapons[j];
		}
		Weapons[j + 1].Type = type;
		Weapons[j + 1].Position = pos;
	}
}